

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

CType * lj_ctype_getfieldq(CTState *cts,CType *ct,GCstr *name,CTSize *ofs,CTInfo *qual)

{
  CType *pCVar1;
  GCstr *in_RCX;
  CType *in_RDX;
  CTState *in_RSI;
  long *in_RDI;
  CTSize *in_R8;
  CTInfo q;
  CType *cct;
  CType *fct;
  uint local_c4;
  uint *local_c0;
  CTInfo *in_stack_ffffffffffffff48;
  
  while( true ) {
    if ((short)in_RSI->top == 0) {
      return (CType *)0x0;
    }
    in_RSI = (CTState *)(*in_RDI + (ulong)(ushort)in_RSI->top * 0x10);
    if ((CType *)(ulong)in_RSI->sizetab == in_RDX) break;
    if (((ulong)in_RSI->tab & 0xf0ff0000) == 0x80030000) {
      local_c4 = 0;
      for (local_c0 = (uint *)(*in_RDI + (ulong)(*(uint *)&in_RSI->tab & 0xffff) * 0x10);
          *local_c0 >> 0x1c == 8; local_c0 = (uint *)(*in_RDI + (ulong)(*local_c0 & 0xffff) * 0x10))
      {
        if ((*local_c0 >> 0x10 & 0xff) == 1) {
          local_c4 = local_c0[1] | local_c4;
        }
      }
      pCVar1 = lj_ctype_getfieldq(in_RSI,in_RDX,in_RCX,in_R8,in_stack_ffffffffffffff48);
      if (pCVar1 != (CType *)0x0) {
        if (in_R8 != (uint *)0x0) {
          *in_R8 = local_c4 | *in_R8;
        }
        (in_RCX->nextgc).gcptr32 = *(int *)((long)&in_RSI->tab + 4) + (in_RCX->nextgc).gcptr32;
        return pCVar1;
      }
      in_stack_ffffffffffffff48 = (CTInfo *)0x0;
    }
  }
  (in_RCX->nextgc).gcptr32 = *(uint32_t *)((long)&in_RSI->tab + 4);
  return (CType *)in_RSI;
}

Assistant:

CType *lj_ctype_getfieldq(CTState *cts, CType *ct, GCstr *name, CTSize *ofs,
			  CTInfo *qual)
{
  while (ct->sib) {
    ct = ctype_get(cts, ct->sib);
    if (gcref(ct->name) == obj2gco(name)) {
      *ofs = ct->size;
      return ct;
    }
    if (ctype_isxattrib(ct->info, CTA_SUBTYPE)) {
      CType *fct, *cct = ctype_child(cts, ct);
      CTInfo q = 0;
      while (ctype_isattrib(cct->info)) {
	if (ctype_attrib(cct->info) == CTA_QUAL) q |= cct->size;
	cct = ctype_child(cts, cct);
      }
      fct = lj_ctype_getfieldq(cts, cct, name, ofs, qual);
      if (fct) {
	if (qual) *qual |= q;
	*ofs += ct->size;
	return fct;
      }
    }
  }
  return NULL;  /* Not found. */
}